

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathLocationSetFilter
               (xmlXPathParserContextPtr ctxt,xmlLocationSetPtr locset,int filterOpIndex,int minPos,
               int maxPos)

{
  ulong uVar1;
  xmlXPathContextPtr pxVar2;
  xmlXPathStepOp *pxVar3;
  xmlNodePtr pxVar4;
  xmlDocPtr pxVar5;
  xmlNodePtr pxVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  xmlXPathObjectPtr *ppxVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  
  if ((locset != (xmlLocationSetPtr)0x0) && (iVar13 = locset->locNr, iVar13 != 0)) {
    pxVar2 = ctxt->context;
    pxVar5 = pxVar2->doc;
    pxVar6 = pxVar2->node;
    iVar7 = pxVar2->contextSize;
    iVar8 = pxVar2->proximityPosition;
    pxVar3 = ctxt->comp->steps;
    pxVar2->contextSize = iVar13;
    if (iVar13 < 1) {
      uVar11 = 0;
      uVar12 = 0;
    }
    else {
      iVar13 = 1;
      uVar11 = 0;
      uVar12 = 0;
      do {
        pxVar4 = (xmlNodePtr)locset->locTab[uVar12]->user;
        pxVar2->node = pxVar4;
        uVar1 = uVar12 + 1;
        pxVar2->proximityPosition = (int)uVar1;
        if ((pxVar4->type != XML_NAMESPACE_DECL) && (pxVar4->doc != (_xmlDoc *)0x0)) {
          pxVar2->doc = pxVar4->doc;
        }
        iVar9 = xmlXPathCompOpEvalToBoolean(ctxt,pxVar3 + filterOpIndex,1);
        if (ctxt->error != 0) goto LAB_001ea18b;
        if (iVar9 < 0) {
          xmlXPathErr(ctxt,7);
          goto LAB_001ea18b;
        }
        if (((iVar9 == 0) || (iVar13 < 1)) || (minPos < iVar13)) {
          xmlXPathFreeObject(locset->locTab[uVar12]);
          locset->locTab[uVar12] = (xmlXPathObjectPtr)0x0;
          if (iVar9 != 0) goto LAB_001ea14f;
        }
        else {
          if (uVar12 != uVar11) {
            locset->locTab[(int)uVar11] = locset->locTab[uVar12];
            locset->locTab[uVar12] = (xmlXPathObjectPtr)0x0;
          }
          uVar11 = uVar11 + 1;
LAB_001ea14f:
          if (iVar13 == minPos) {
            uVar12 = (ulong)((int)uVar12 + 1);
            goto LAB_001ea18b;
          }
          iVar13 = iVar13 + 1;
        }
        uVar12 = uVar1;
      } while ((long)uVar1 < (long)locset->locNr);
      uVar12 = uVar1 & 0xffffffff;
    }
LAB_001ea18b:
    if ((int)uVar12 < locset->locNr) {
      uVar12 = uVar12 & 0xffffffff;
      do {
        xmlXPathFreeObject(locset->locTab[uVar12]);
        uVar12 = uVar12 + 1;
      } while ((long)uVar12 < (long)locset->locNr);
    }
    locset->locNr = uVar11;
    if ((10 < locset->locMax) && ((int)uVar11 < (int)((uint)locset->locMax >> 1))) {
      uVar12 = 10;
      if (10 < (int)uVar11) {
        uVar12 = (ulong)uVar11;
      }
      ppxVar10 = (xmlXPathObjectPtr *)(*xmlRealloc)(locset->locTab,uVar12 * 8);
      if (ppxVar10 == (xmlXPathObjectPtr *)0x0) {
        ctxt->error = 0xf;
        xmlXPathErrMemory(ctxt->context,"shrinking locset\n");
      }
      else {
        locset->locTab = ppxVar10;
        locset->locMax = (int)uVar12;
      }
    }
    pxVar2->doc = pxVar5;
    pxVar2->node = pxVar6;
    pxVar2->contextSize = iVar7;
    pxVar2->proximityPosition = iVar8;
  }
  return;
}

Assistant:

static void
xmlXPathLocationSetFilter(xmlXPathParserContextPtr ctxt,
		          xmlLocationSetPtr locset,
		          int filterOpIndex,
                          int minPos, int maxPos)
{
    xmlXPathContextPtr xpctxt;
    xmlNodePtr oldnode;
    xmlDocPtr olddoc;
    xmlXPathStepOpPtr filterOp;
    int oldcs, oldpp;
    int i, j, pos;

    if ((locset == NULL) || (locset->locNr == 0) || (filterOpIndex == -1))
        return;

    xpctxt = ctxt->context;
    oldnode = xpctxt->node;
    olddoc = xpctxt->doc;
    oldcs = xpctxt->contextSize;
    oldpp = xpctxt->proximityPosition;
    filterOp = &ctxt->comp->steps[filterOpIndex];

    xpctxt->contextSize = locset->locNr;

    for (i = 0, j = 0, pos = 1; i < locset->locNr; i++) {
        xmlNodePtr contextNode = locset->locTab[i]->user;
        int res;

        xpctxt->node = contextNode;
        xpctxt->proximityPosition = i + 1;

        /*
        * Also set the xpath document in case things like
        * key() are evaluated in the predicate.
        *
        * TODO: Get real doc for namespace nodes.
        */
        if ((contextNode->type != XML_NAMESPACE_DECL) &&
            (contextNode->doc != NULL))
            xpctxt->doc = contextNode->doc;

        res = xmlXPathCompOpEvalToBoolean(ctxt, filterOp, 1);

        if (ctxt->error != XPATH_EXPRESSION_OK)
            break;
        if (res < 0) {
            /* Shouldn't happen */
            xmlXPathErr(ctxt, XPATH_EXPR_ERROR);
            break;
        }

        if ((res != 0) && ((pos >= minPos) && (pos <= maxPos))) {
            if (i != j) {
                locset->locTab[j] = locset->locTab[i];
                locset->locTab[i] = NULL;
            }

            j += 1;
        } else {
            /* Remove the entry from the initial location set. */
            xmlXPathFreeObject(locset->locTab[i]);
            locset->locTab[i] = NULL;
        }

        if (res != 0) {
            if (pos == maxPos) {
                i += 1;
                break;
            }

            pos += 1;
        }
    }

    /* Free remaining nodes. */
    for (; i < locset->locNr; i++)
        xmlXPathFreeObject(locset->locTab[i]);

    locset->locNr = j;

    /* If too many elements were removed, shrink table to preserve memory. */
    if ((locset->locMax > XML_NODESET_DEFAULT) &&
        (locset->locNr < locset->locMax / 2)) {
        xmlXPathObjectPtr *tmp;
        int locMax = locset->locNr;

        if (locMax < XML_NODESET_DEFAULT)
            locMax = XML_NODESET_DEFAULT;
        tmp = (xmlXPathObjectPtr *) xmlRealloc(locset->locTab,
                locMax * sizeof(xmlXPathObjectPtr));
        if (tmp == NULL) {
            xmlXPathPErrMemory(ctxt, "shrinking locset\n");
        } else {
            locset->locTab = tmp;
            locset->locMax = locMax;
        }
    }

    xpctxt->node = oldnode;
    xpctxt->doc = olddoc;
    xpctxt->contextSize = oldcs;
    xpctxt->proximityPosition = oldpp;
}